

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryBefore
          (CollationRootElements *this,uint32_t p,uint32_t s,uint32_t t)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (p == 0) {
    uVar3 = this->elements[(uint)(s != 0)];
    uVar5 = (uint)(s != 0) << 8;
    uVar6 = (ulong)(this->elements[(int)uVar3] & 0xffffff7f);
  }
  else {
    iVar2 = findP(this,p);
    uVar3 = iVar2 + 1;
    uVar5 = this->elements[(long)iVar2 + 1] & 0xffffff7f;
    if (0x50004ff < uVar5) {
      uVar5 = 0x5000500;
    }
    uVar6 = (ulong)uVar5;
    if (-1 < (char)this->elements[(long)iVar2 + 1]) {
      uVar6 = 0x5000500;
    }
    uVar5 = 0x100;
  }
  uVar7 = s << 0x10 | t;
  if ((uint)uVar6 < uVar7) {
    puVar4 = this->elements + (int)uVar3;
    do {
      if ((uint32_t)(uVar6 >> 0x10) == s) {
        uVar5 = (uint)uVar6;
      }
      uVar1 = *puVar4;
      uVar6 = (ulong)(uVar1 & 0xffffff7f);
      puVar4 = puVar4 + 1;
    } while ((uVar1 & 0xffffff7f) < uVar7);
  }
  return uVar5 & 0xffff;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryBefore(uint32_t p, uint32_t s, uint32_t t) const {
    U_ASSERT((t & ~Collation::ONLY_TERTIARY_MASK) == 0);
    int32_t index;
    uint32_t previousTer, secTer;
    if(p == 0) {
        if(s == 0) {
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the beginning of the tertiary CE range.
            previousTer = 0;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            previousTer = Collation::BEFORE_WEIGHT16;
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        index = findPrimary(p) + 1;
        previousTer = Collation::BEFORE_WEIGHT16;
        secTer = getFirstSecTerForPrimary(index);
    }
    uint32_t st = (s << 16) | t;
    while(st > secTer) {
        if((secTer >> 16) == s) { previousTer = secTer; }
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        secTer = elements[index++] & ~SEC_TER_DELTA_FLAG;
    }
    U_ASSERT(secTer == st);
    return previousTer & 0xffff;
}